

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

int m2v_LU_decomp_inplace(m2v *A,int *rp,int *cp)

{
  m2v_base mVar1;
  m2v_base *pmVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint *puVar11;
  uint c2;
  ulong uVar12;
  long lVar13;
  
  if (0 < A->n_row) {
    lVar3 = 0;
    do {
      rp[lVar3] = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 < A->n_row);
  }
  if (0 < A->n_col) {
    lVar3 = 0;
    do {
      cp[lVar3] = (int)lVar3;
      lVar3 = lVar3 + 1;
      lVar13 = (long)A->n_col;
    } while (lVar3 < lVar13);
    if (0 < A->n_col) {
      uVar5 = (ulong)(uint)A->n_row;
      lVar3 = 0;
      uVar12 = 0;
      while ((c2 = (uint)uVar12, (long)uVar12 < (long)(int)uVar5 &&
             ((long)uVar12 < (long)(int)lVar13))) {
        pmVar2 = A->e;
        uVar4 = uVar12;
LAB_00102aa6:
        puVar11 = (uint *)((long)pmVar2 + (uVar4 >> 5) * 4 + lVar3 * A->row_stride);
        uVar10 = uVar12 & 0xffffffff;
        uVar8 = uVar12;
        while ((*puVar11 & 1 << ((byte)uVar4 & 0x1f)) == 0) {
          uVar8 = uVar8 + 1;
          puVar11 = puVar11 + A->row_stride;
          uVar10 = (ulong)((int)uVar10 + 1);
          if ((uVar5 & 0xffffffff) == uVar8) goto code_r0x00102ad3;
        }
        uVar8 = uVar8 & 0xffffffff;
        if (uVar8 != uVar12) {
          iVar7 = rp[uVar8];
          rp[uVar8] = rp[uVar12];
          rp[uVar12] = iVar7;
          iVar7 = A->row_stride;
          if (0 < (long)iVar7) {
            uVar9 = (int)uVar10 * iVar7;
            lVar13 = iVar7 * lVar3;
            lVar6 = 0;
            do {
              mVar1 = *(m2v_base *)((long)pmVar2 + lVar6 * 4 + lVar13);
              *(m2v_base *)((long)pmVar2 + lVar6 * 4 + lVar13) = pmVar2[(ulong)uVar9 + lVar6];
              pmVar2[(ulong)uVar9 + lVar6] = mVar1;
              lVar6 = lVar6 + 1;
            } while (lVar6 < A->row_stride);
          }
        }
        uVar5 = uVar4 & 0xffffffff;
        if (uVar12 != uVar5) {
          iVar7 = cp[uVar5];
          cp[uVar5] = cp[uVar12];
          cp[uVar12] = iVar7;
          m2v_swap_cols(A,(int)uVar4,c2);
        }
        uVar4 = uVar12 + 1;
        uVar5 = (ulong)A->n_row;
        if ((long)uVar4 < (long)uVar5) {
          uVar8 = uVar4 & 0xffffffff;
          do {
            iVar7 = (int)uVar8;
            m2v_multadd_row_from
                      (A,c2,c2 + 1,
                       (uint)((A->e[(int)(A->row_stride * iVar7 + ((uint)(uVar12 >> 5) & 0x7ffffff))
                                   ] >> (c2 & 0x1f) & 1) != 0),A,iVar7);
            uVar8 = (ulong)(iVar7 + 1U);
            uVar5 = (ulong)(uint)A->n_row;
          } while ((int)(iVar7 + 1U) < A->n_row);
        }
        lVar13 = (long)A->n_col;
        lVar3 = lVar3 + 4;
        uVar12 = uVar4;
        if (lVar13 <= (long)uVar4) goto LAB_00102be8;
      }
LAB_00102be5:
      uVar4 = uVar12 & 0xffffffff;
      goto LAB_00102be8;
    }
  }
  uVar4 = 0;
LAB_00102be8:
  return (int)uVar4;
code_r0x00102ad3:
  uVar4 = uVar4 + 1;
  if ((int)uVar4 == (int)lVar13) goto LAB_00102be5;
  goto LAB_00102aa6;
}

Assistant:

int MV_GEN_N(_LU_decomp_inplace)(MV_GEN_TYPE* A,
				int* rp,
				int* cp)
{
	/* Initialize permutations */
	int i;
	for (i = 0; i < A->n_row; ++i)
		rp[i] = i;
	for (i = 0; i < A->n_col; ++i)
		cp[i] = i;

	/* LU decomposition */
	for (i = 0; i < A->n_col && i < A->n_row; ++i) {
		/* Find a pivot
		 *
		 * We must pick in A to process that does not lead to a
		 * zero value on the diagonal of U, for otherwise we
		 * can't keep processing.
		 *
		 * Find a row such that the resulting U[i,i]
		 * will be nonzero.
		 */
		int prow;
		int pcol;
		for (pcol = i; pcol < A->n_col; ++pcol) {
			for (prow = i; prow < A->n_row; ++prow) {
				if (MV_GEN_N(_get_el)(A, prow, pcol) != 0) {
					goto pivot_found;
				}
			}
		}

		/* No pivot found; maximum rank reached */
		assert (pcol == A->n_col);
		break;
pivot_found:

		/* Permute row and column to get pivot into place,
		   and record */
		if (prow != i) {
			SwapInt(rp[i], rp[prow]);
			MV_GEN_N(_swap_rows)(A, i, prow);
		}
		if (pcol != i) {
			SwapInt(cp[i], cp[pcol]);
			MV_GEN_N(_swap_cols)(A, pcol, i);
		}

		/* At this point, the row i of U is computed correctly
		 * already, due to the updates to a (see below, "update
		 * A in the undecomposed part").  The column i of L is
		 * not quite correct yet; we need to divide the entries
		 * by Uii.
		 */

		/* Compute the column i of L */
		MV_GEN_ELTYPE Uii_inv = finv(MV_GEN_N(_get_el)(A, i, i));
		MV_GEN_N(_mult_col_from)(A, i, i + 1, Uii_inv);

		/* Update A in the yet undecomposed part */
		for (int j = i + 1; j < A->n_row; ++j) {
			const MV_GEN_ELTYPE Lji = MV_GEN_N(_get_el)(A, j, i);
			MV_GEN_N(_multadd_row_from)(A, i, i + 1, Lji, A, j);
		}
	}

	/* At this point, i is the rank of the matrix */
	return i;
}